

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dequantize_x86.cpp
# Opt level: O1

void ncnn::dequantize(int *intptr,float *ptr,Mat *scale_data,Mat *bias_data,int elemcount,
                     int elempack)

{
  undefined4 uVar1;
  undefined1 (*pauVar2) [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 in_ZMM6 [64];
  undefined1 in_ZMM7 [64];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar13 [28];
  undefined1 auVar17 [32];
  
  pauVar2 = (undefined1 (*) [32])scale_data->data;
  uVar1 = *(undefined4 *)*pauVar2;
  auVar12._4_4_ = uVar1;
  auVar12._0_4_ = uVar1;
  auVar12._8_4_ = uVar1;
  auVar12._12_4_ = uVar1;
  auVar13._16_4_ = uVar1;
  auVar13._0_16_ = auVar12;
  auVar13._20_4_ = uVar1;
  auVar13._24_4_ = uVar1;
  auVar14 = auVar12;
  if (1 < scale_data->w) {
    if (elempack == 4) {
      auVar14 = *(undefined1 (*) [16])*pauVar2;
      auVar19._16_16_ = auVar14;
      auVar19._0_16_ = auVar14;
      auVar13 = auVar19._0_28_;
    }
    else if (elempack == 8) {
      auVar13 = SUB3228(*pauVar2,0);
    }
  }
  uVar10 = elemcount * elempack;
  if (bias_data->w == 0) {
    uVar6 = 0;
    if (7 < (int)uVar10) {
      uVar6 = uVar10 & 0x7ffffff8;
      iVar7 = 7;
      do {
        auVar19 = vcvtdq2ps_avx(*(undefined1 (*) [32])intptr);
        *ptr = auVar13._0_4_ * auVar19._0_4_;
        ptr[1] = auVar13._4_4_ * auVar19._4_4_;
        ptr[2] = auVar13._8_4_ * auVar19._8_4_;
        ptr[3] = auVar13._12_4_ * auVar19._12_4_;
        ptr[4] = auVar13._16_4_ * auVar19._16_4_;
        ptr[5] = auVar13._20_4_ * auVar19._20_4_;
        ptr[6] = auVar13._24_4_ * auVar19._24_4_;
        ptr[7] = auVar19._28_4_;
        intptr = (int *)((long)intptr + 0x20);
        ptr = ptr + 8;
        iVar7 = iVar7 + 8;
      } while (iVar7 < (int)uVar10);
    }
    uVar8 = uVar6 | 3;
    auVar19 = _DAT_005f1780;
    auVar17 = _DAT_005f17a0;
    while (_DAT_005f1780 = auVar19, _DAT_005f17a0 = auVar17, (int)uVar8 < (int)uVar10) {
      auVar15 = vcvtdq2ps_avx(*(undefined1 (*) [16])*(undefined1 (*) [32])intptr);
      *ptr = auVar14._0_4_ * auVar15._0_4_;
      ptr[1] = auVar14._4_4_ * auVar15._4_4_;
      ptr[2] = auVar14._8_4_ * auVar15._8_4_;
      ptr[3] = auVar14._12_4_ * auVar15._12_4_;
      intptr = (int *)(*(undefined1 (*) [32])intptr + 0x10);
      ptr = ptr + 4;
      uVar8 = uVar6 + 7;
      uVar6 = uVar6 + 4;
      auVar19 = _DAT_005f1780;
      auVar17 = _DAT_005f17a0;
    }
    if ((int)uVar6 < (int)uVar10) {
      uVar11 = CONCAT44(0,uVar10 + ~uVar6);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar11;
      auVar15 = vpshufd_avx(auVar14,0x44);
      auVar3 = vshufps_avx(auVar12,auVar12,0);
      uVar9 = 0;
      auVar18._8_8_ = 0x8000000000000000;
      auVar18._0_8_ = 0x8000000000000000;
      auVar14 = vorps_avx(auVar15,auVar18);
      auVar12 = vorps_avx(auVar15,auVar18);
      auVar16 = vpcmpeqd_avx(in_ZMM6._0_16_,in_ZMM6._0_16_);
      auVar15 = vorps_avx(auVar15,auVar18);
      do {
        auVar21._8_8_ = 0;
        auVar21._0_8_ = uVar9;
        auVar18 = vpshufd_avx(auVar21,0x44);
        auVar23._16_16_ = auVar18;
        auVar23._0_16_ = auVar18;
        auVar4 = vorps_avx(auVar23,auVar19);
        auVar5 = vorps_avx(auVar23,auVar17);
        auVar30._0_8_ = auVar5._16_8_ ^ 0x8000000000000000;
        auVar30._8_4_ = auVar5._24_4_;
        auVar30._12_4_ = auVar5._28_4_ ^ 0x80000000;
        auVar18 = vpcmpgtq_avx(auVar30,auVar14);
        auVar22._0_8_ = auVar5._0_8_ ^ 0x8000000000000000;
        auVar22._8_4_ = auVar5._8_4_;
        auVar22._12_4_ = auVar5._12_4_ ^ 0x80000000;
        auVar21 = vpcmpgtq_avx(auVar22,auVar12);
        auVar18 = vpackssdw_avx(auVar21,auVar18);
        auVar31._0_8_ = auVar4._16_8_ ^ 0x8000000000000000;
        auVar31._8_4_ = auVar4._24_4_;
        auVar31._12_4_ = auVar4._28_4_ ^ 0x80000000;
        auVar21 = vpcmpgtq_avx(auVar31,auVar14);
        auVar25._0_8_ = auVar4._0_8_ ^ 0x8000000000000000;
        auVar25._8_4_ = auVar4._8_4_;
        auVar25._12_4_ = auVar4._12_4_ ^ 0x80000000;
        auVar22 = vpcmpgtq_avx(auVar25,auVar15);
        auVar21 = vpackssdw_avx(auVar22,auVar21);
        auVar18 = vpackssdw_avx(auVar21 ^ auVar16,auVar18 ^ auVar16);
        auVar21 = vpmovsxwd_avx(auVar18);
        auVar18 = vpunpckhwd_avx(auVar18,auVar18);
        auVar24._16_16_ = auVar18;
        auVar24._0_16_ = auVar21;
        auVar4 = vmaskmovps_avx(auVar24,*(undefined1 (*) [32])
                                         (*(undefined1 (*) [32])intptr + uVar9 * 4));
        auVar4 = vcvtdq2ps_avx(auVar4);
        auVar5._4_4_ = auVar4._4_4_ * auVar3._4_4_;
        auVar5._0_4_ = auVar4._0_4_ * auVar3._0_4_;
        auVar5._8_4_ = auVar4._8_4_ * auVar3._8_4_;
        auVar5._12_4_ = auVar4._12_4_ * auVar3._12_4_;
        auVar5._16_4_ = auVar4._16_4_ * auVar3._0_4_;
        auVar5._20_4_ = auVar4._20_4_ * auVar3._4_4_;
        auVar5._24_4_ = auVar4._24_4_ * auVar3._8_4_;
        auVar5._28_4_ = auVar4._28_4_;
        auVar4 = vmaskmovps_avx(auVar24,auVar5);
        *(undefined1 (*) [32])(ptr + uVar9) = auVar4;
        uVar9 = uVar9 + 8;
      } while ((uVar11 + 8 & 0xfffffffffffffff8) != uVar9);
    }
  }
  else {
    pauVar2 = (undefined1 (*) [32])bias_data->data;
    uVar1 = *(undefined4 *)*pauVar2;
    auVar16._4_4_ = uVar1;
    auVar16._0_4_ = uVar1;
    auVar16._8_4_ = uVar1;
    auVar16._12_4_ = uVar1;
    auVar17._16_4_ = uVar1;
    auVar17._0_16_ = auVar16;
    auVar17._20_4_ = uVar1;
    auVar17._24_4_ = uVar1;
    auVar17._28_4_ = uVar1;
    auVar15 = auVar16;
    if (1 < bias_data->w) {
      if (elempack == 4) {
        auVar15 = *(undefined1 (*) [16])*pauVar2;
        auVar17._16_16_ = auVar15;
        auVar17._0_16_ = auVar15;
      }
      else if (elempack == 8) {
        auVar17 = *pauVar2;
      }
    }
    uVar6 = 0;
    if (7 < (int)uVar10) {
      uVar6 = uVar10 & 0x7ffffff8;
      iVar7 = 7;
      do {
        auVar19 = vcvtdq2ps_avx(*(undefined1 (*) [32])intptr);
        *ptr = auVar13._0_4_ * auVar19._0_4_ + auVar17._0_4_;
        ptr[1] = auVar13._4_4_ * auVar19._4_4_ + auVar17._4_4_;
        ptr[2] = auVar13._8_4_ * auVar19._8_4_ + auVar17._8_4_;
        ptr[3] = auVar13._12_4_ * auVar19._12_4_ + auVar17._12_4_;
        ptr[4] = auVar13._16_4_ * auVar19._16_4_ + auVar17._16_4_;
        ptr[5] = auVar13._20_4_ * auVar19._20_4_ + auVar17._20_4_;
        ptr[6] = auVar13._24_4_ * auVar19._24_4_ + auVar17._24_4_;
        ptr[7] = auVar19._28_4_ + auVar17._28_4_;
        intptr = (int *)((long)intptr + 0x20);
        ptr = ptr + 8;
        iVar7 = iVar7 + 8;
      } while (iVar7 < (int)uVar10);
    }
    uVar8 = uVar6 | 3;
    auVar19 = _DAT_005f1780;
    auVar17 = _DAT_005f17a0;
    while (_DAT_005f1780 = auVar19, _DAT_005f17a0 = auVar17, (int)uVar8 < (int)uVar10) {
      auVar3 = vcvtdq2ps_avx(*(undefined1 (*) [16])*(undefined1 (*) [32])intptr);
      *ptr = auVar14._0_4_ * auVar3._0_4_ + auVar15._0_4_;
      ptr[1] = auVar14._4_4_ * auVar3._4_4_ + auVar15._4_4_;
      ptr[2] = auVar14._8_4_ * auVar3._8_4_ + auVar15._8_4_;
      ptr[3] = auVar14._12_4_ * auVar3._12_4_ + auVar15._12_4_;
      intptr = (int *)(*(undefined1 (*) [32])intptr + 0x10);
      ptr = ptr + 4;
      uVar8 = uVar6 + 7;
      uVar6 = uVar6 + 4;
      auVar19 = _DAT_005f1780;
      auVar17 = _DAT_005f17a0;
    }
    if ((int)uVar6 < (int)uVar10) {
      uVar11 = CONCAT44(0,uVar10 + ~uVar6);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uVar11;
      auVar15 = vpshufd_avx(auVar15,0x44);
      auVar3 = vshufps_avx(auVar12,auVar12,0);
      auVar18 = vshufps_avx(auVar16,auVar16,0);
      uVar9 = 0;
      auVar20._8_8_ = 0x8000000000000000;
      auVar20._0_8_ = 0x8000000000000000;
      auVar14 = vorps_avx(auVar15,auVar20);
      auVar12 = vorps_avx(auVar15,auVar20);
      auVar16 = vpcmpeqd_avx(in_ZMM7._0_16_,in_ZMM7._0_16_);
      auVar15 = vorps_avx(auVar15,auVar20);
      do {
        auVar26._8_8_ = 0;
        auVar26._0_8_ = uVar9;
        auVar21 = vpshufd_avx(auVar26,0x44);
        auVar28._16_16_ = auVar21;
        auVar28._0_16_ = auVar21;
        auVar4 = vorps_avx(auVar28,auVar19);
        auVar5 = vorps_avx(auVar28,auVar17);
        auVar34._0_8_ = auVar5._16_8_ ^ 0x8000000000000000;
        auVar34._8_4_ = auVar5._24_4_;
        auVar34._12_4_ = auVar5._28_4_ ^ 0x80000000;
        auVar21 = vpcmpgtq_avx(auVar34,auVar14);
        auVar27._0_8_ = auVar5._0_8_ ^ 0x8000000000000000;
        auVar27._8_4_ = auVar5._8_4_;
        auVar27._12_4_ = auVar5._12_4_ ^ 0x80000000;
        auVar22 = vpcmpgtq_avx(auVar27,auVar12);
        auVar21 = vpackssdw_avx(auVar22,auVar21);
        auVar35._0_8_ = auVar4._16_8_ ^ 0x8000000000000000;
        auVar35._8_4_ = auVar4._24_4_;
        auVar35._12_4_ = auVar4._28_4_ ^ 0x80000000;
        auVar22 = vpcmpgtq_avx(auVar35,auVar14);
        auVar32._0_8_ = auVar4._0_8_ ^ 0x8000000000000000;
        auVar32._8_4_ = auVar4._8_4_;
        auVar32._12_4_ = auVar4._12_4_ ^ 0x80000000;
        auVar25 = vpcmpgtq_avx(auVar32,auVar15);
        auVar22 = vpackssdw_avx(auVar25,auVar22);
        auVar21 = vpackssdw_avx(auVar22 ^ auVar16,auVar21 ^ auVar16);
        auVar22 = vpmovsxwd_avx(auVar21);
        auVar21 = vpunpckhwd_avx(auVar21,auVar21);
        auVar29._16_16_ = auVar21;
        auVar29._0_16_ = auVar22;
        auVar4 = vmaskmovps_avx(auVar29,*(undefined1 (*) [32])
                                         (*(undefined1 (*) [32])intptr + uVar9 * 4));
        auVar4 = vcvtdq2ps_avx(auVar4);
        auVar33._0_4_ = auVar4._0_4_ * auVar3._0_4_ + auVar18._0_4_;
        auVar33._4_4_ = auVar4._4_4_ * auVar3._4_4_ + auVar18._4_4_;
        auVar33._8_4_ = auVar4._8_4_ * auVar3._8_4_ + auVar18._8_4_;
        auVar33._12_4_ = auVar4._12_4_ * auVar3._12_4_ + auVar18._12_4_;
        auVar33._16_4_ = auVar4._16_4_ * auVar3._0_4_ + auVar18._0_4_;
        auVar33._20_4_ = auVar4._20_4_ * auVar3._4_4_ + auVar18._4_4_;
        auVar33._24_4_ = auVar4._24_4_ * auVar3._8_4_ + auVar18._8_4_;
        auVar33._28_4_ = auVar4._28_4_ + auVar18._12_4_;
        auVar4 = vmaskmovps_avx(auVar29,auVar33);
        *(undefined1 (*) [32])(ptr + uVar9) = auVar4;
        uVar9 = uVar9 + 8;
      } while ((uVar11 + 8 & 0xfffffffffffffff8) != uVar9);
    }
  }
  return;
}

Assistant:

static void dequantize(const int* intptr, float* ptr, const Mat& scale_data, const Mat& bias_data, int elemcount, int elempack)
{
    const int scale_data_size = scale_data.w;
    const int bias_data_size = bias_data.w;
    const int size = elemcount * elempack;

    // NCNN_LOGE("dequantize %d %d   %d %d", scale_data_size, bias_data_size, elemcount, elempack);

    float scale = scale_data[0];
#if __SSE2__
    __m128 _scale = _mm_set1_ps(scale);
#if __AVX__
    __m256 _scale_avx = _mm256_set1_ps(scale);
#if __AVX512F__
    __m512 _scale_avx512 = _mm512_set1_ps(scale);
#endif // __AVX512F__
#endif // __AVX__
    if (scale_data_size > 1)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            _scale_avx512 = _mm512_loadu_ps((const float*)scale_data);
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            _scale_avx = _mm256_loadu_ps((const float*)scale_data);
#if __AVX512F__
            _scale_avx512 = combine8x2_ps(_scale_avx, _scale_avx);
#endif // __AVX512F__
        }
#endif // __AVX__
        if (elempack == 4)
        {
            _scale = _mm_loadu_ps((const float*)scale_data);
#if __AVX__
            _scale_avx = combine4x2_ps(_scale, _scale);
#if __AVX512F__
            _scale_avx512 = combine8x2_ps(_scale_avx, _scale_avx);
#endif // __AVX512F__
#endif // __AVX__
        }
    }
#endif // __SSE2__

    if (bias_data_size == 0)
    {
        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _v = _mm512_cvtepi32_ps(_mm512_loadu_si512((const __m512i*)intptr));
            _v = _mm512_mul_ps(_v, _scale_avx512);
            _mm512_storeu_ps(ptr, _v);
            intptr += 16;
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _v = _mm256_cvtepi32_ps(_mm256_loadu_si256((const __m256i*)intptr));
            _v = _mm256_mul_ps(_v, _scale_avx);
            _mm256_storeu_ps(ptr, _v);
            intptr += 8;
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _v = _mm_cvtepi32_ps(_mm_loadu_si128((const __m128i*)intptr));
            _v = _mm_mul_ps(_v, _scale);
            _mm_storeu_ps(ptr, _v);
            intptr += 4;
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *intptr * scale;
            intptr++;
            ptr++;
        }
    }
    else
    {
        float bias = bias_data[0];
#if __SSE2__
        __m128 _bias = _mm_set1_ps(bias);
#if __AVX__
        __m256 _bias_avx = _mm256_set1_ps(bias);
#if __AVX512F__
        __m512 _bias_avx512 = _mm512_set1_ps(bias);
#endif // __AVX512F__
#endif // __AVX__
        if (bias_data_size > 1)
        {
#if __AVX__
#if __AVX512F__
            if (elempack == 16)
            {
                _bias_avx512 = _mm512_loadu_ps((const float*)bias_data);
            }
#endif // __AVX512F__
            if (elempack == 8)
            {
                _bias_avx = _mm256_loadu_ps((const float*)bias_data);
#if __AVX512F__
                _bias_avx512 = combine8x2_ps(_bias_avx, _bias_avx);
#endif // __AVX512F__
            }
#endif // __AVX__
            if (elempack == 4)
            {
                _bias = _mm_loadu_ps((const float*)bias_data);
#if __AVX__
                _bias_avx = combine4x2_ps(_bias, _bias);
#if __AVX512F__
                _bias_avx512 = combine8x2_ps(_bias_avx, _bias_avx);
#endif // __AVX512F__
#endif // __AVX__
            }
        }
#endif // __SSE2__

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _v = _mm512_cvtepi32_ps(_mm512_loadu_si512((const __m512i*)intptr));
            _v = _mm512_fmadd_ps(_v, _scale_avx512, _bias_avx512);
            _mm512_storeu_ps(ptr, _v);
            intptr += 16;
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _v = _mm256_cvtepi32_ps(_mm256_loadu_si256((const __m256i*)intptr));
            _v = _mm256_comp_fmadd_ps(_v, _scale_avx, _bias_avx);
            _mm256_storeu_ps(ptr, _v);
            intptr += 8;
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _v = _mm_cvtepi32_ps(_mm_loadu_si128((const __m128i*)intptr));
            _v = _mm_comp_fmadd_ps(_v, _scale, _bias);
            _mm_storeu_ps(ptr, _v);
            intptr += 4;
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *intptr * scale + bias;
            intptr++;
            ptr++;
        }
    }
}